

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

iterator * __thiscall
rangeless::fn::impl::
seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>
::iterator::operator++(iterator *this)

{
  bool bVar1;
  subgen *psVar2;
  X *pXVar3;
  maybe<rangeless::fn::impl::X> local_2c;
  seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>
  *local_20;
  seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>
  *p;
  iterator *this_local;
  
  if ((this->m_parent ==
       (seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>
        *)0x0) || ((this->m_parent->m_ended & 1U) != 0)) {
    this->m_parent =
         (seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>
          *)0x0;
  }
  else {
    local_20 = this->m_parent;
    p = (seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>
         *)this;
    bVar1 = impl::maybe::operator_cast_to_bool((maybe *)local_20);
    if (bVar1) {
      psVar2 = &local_20->m_gen;
      pXVar3 = maybe<rangeless::fn::impl::X>::operator*(&local_20->m_current);
      recycle<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>>::subgen,rangeless::fn::impl::X>
                (psVar2,pXVar3);
    }
    group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::
    gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
    ::subgen::operator()((subgen *)&local_2c);
    maybe<rangeless::fn::impl::X>::operator=(&local_20->m_current,&local_2c);
    maybe<rangeless::fn::impl::X>::~maybe(&local_2c);
    bVar1 = impl::maybe::operator_cast_to_bool((maybe *)local_20);
    if (!bVar1) {
      local_20->m_ended = true;
      this->m_parent =
           (seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>
            *)0x0;
    }
  }
  return this;
}

Assistant:

iterator& operator++()
            {
                if(!m_parent || m_parent->m_ended) {
                    m_parent = nullptr;
                    return *this;
                }

                auto& p = *m_parent;

                if(p.m_current) {
                    impl::recycle(p.m_gen, *p.m_current, resolve_overload{});
                }

                p.m_current = p.m_gen();

                if(!p.m_current) {
                    p.m_ended = true;
                    m_parent = nullptr; // reached end
                }
                return *this;
            }